

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_ecdsa_sign(mbedtls_ecp_keypair *ecp,psa_algorithm_t alg,uint8_t *hash,size_t hash_length,
              uint8_t *signature,size_t signature_size,size_t *signature_length)

{
  mbedtls_md_type_t md_alg_00;
  psa_status_t pVar1;
  ulong buflen;
  mbedtls_md_info_t *md_info_00;
  psa_algorithm_t local_94;
  uint local_90;
  mbedtls_md_type_t md_alg;
  mbedtls_md_info_t *md_info;
  psa_algorithm_t hash_alg;
  size_t curve_bytes;
  mbedtls_mpi s;
  mbedtls_mpi r;
  int ret;
  size_t signature_size_local;
  uint8_t *signature_local;
  size_t hash_length_local;
  uint8_t *hash_local;
  psa_algorithm_t alg_local;
  mbedtls_ecp_keypair *ecp_local;
  
  buflen = (ecp->grp).pbits + 7 >> 3;
  mbedtls_mpi_init((mbedtls_mpi *)&s.p);
  mbedtls_mpi_init((mbedtls_mpi *)&curve_bytes);
  if (signature_size < buflen << 1) {
    r.p._4_4_ = -0x4f00;
  }
  else {
    if ((alg & 0x10000) == 0) {
      r.p._4_4_ = mbedtls_ecdsa_sign(&ecp->grp,(mbedtls_mpi *)&s.p,(mbedtls_mpi *)&curve_bytes,
                                     &ecp->d,hash,hash_length,mbedtls_ctr_drbg_random,
                                     &global_data.ctr_drbg);
    }
    else {
      if (((((alg & 0xffffff00) == 0x10030000) || ((alg & 0xffffff00) == 0x10020000)) ||
          ((alg & 0xfffeff00) == 0x10040000)) || ((alg & 0xfffeff00) == 0x10060000)) {
        if ((alg & 0xff) == 0) {
          local_90 = 0;
        }
        else {
          local_90 = alg & 0xff | 0x1000000;
        }
        local_94 = local_90;
      }
      else {
        local_94 = 0;
      }
      md_info_00 = mbedtls_md_info_from_psa(local_94);
      md_alg_00 = mbedtls_md_get_type(md_info_00);
      r.p._4_4_ = mbedtls_ecdsa_sign_det_ext
                            (&ecp->grp,(mbedtls_mpi *)&s.p,(mbedtls_mpi *)&curve_bytes,&ecp->d,hash,
                             hash_length,md_alg_00,mbedtls_ctr_drbg_random,&global_data.ctr_drbg);
    }
    if ((r.p._4_4_ == 0) &&
       (r.p._4_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)&s.p,signature,buflen), r.p._4_4_ == 0))
    {
      r.p._4_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)&curve_bytes,signature + buflen,buflen);
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)&s.p);
  mbedtls_mpi_free((mbedtls_mpi *)&curve_bytes);
  if (r.p._4_4_ == 0) {
    *signature_length = buflen << 1;
  }
  pVar1 = mbedtls_to_psa_error(r.p._4_4_);
  return pVar1;
}

Assistant:

static psa_status_t psa_ecdsa_sign( mbedtls_ecp_keypair *ecp,
                                    psa_algorithm_t alg,
                                    const uint8_t *hash,
                                    size_t hash_length,
                                    uint8_t *signature,
                                    size_t signature_size,
                                    size_t *signature_length )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi r, s;
    size_t curve_bytes = PSA_BITS_TO_BYTES( ecp->grp.pbits );
    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

    if( signature_size < 2 * curve_bytes )
    {
        ret = MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
        goto cleanup;
    }

#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    if( PSA_ALG_DSA_IS_DETERMINISTIC( alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_SIGN_GET_HASH( alg );
        const mbedtls_md_info_t *md_info = mbedtls_md_info_from_psa( hash_alg );
        mbedtls_md_type_t md_alg = mbedtls_md_get_type( md_info );
        MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign_det_ext( &ecp->grp, &r, &s,
                                                     &ecp->d, hash,
                                                     hash_length, md_alg,
                                                     mbedtls_ctr_drbg_random,
                                                     &global_data.ctr_drbg ) );
    }
    else
#endif /* MBEDTLS_ECDSA_DETERMINISTIC */
    {
        (void) alg;
        MBEDTLS_MPI_CHK( mbedtls_ecdsa_sign( &ecp->grp, &r, &s, &ecp->d,
                                             hash, hash_length,
                                             mbedtls_ctr_drbg_random,
                                             &global_data.ctr_drbg ) );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &r,
                                               signature,
                                               curve_bytes ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &s,
                                               signature + curve_bytes,
                                               curve_bytes ) );

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );
    if( ret == 0 )
        *signature_length = 2 * curve_bytes;
    return( mbedtls_to_psa_error( ret ) );
}